

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.h
# Opt level: O0

cmCommand * __thiscall cmSetCommand::Clone(cmSetCommand *this)

{
  cmCommand *this_00;
  cmSetCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmSetCommand((cmSetCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmSetCommand; }